

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ReadFileResult
anon_unknown.dwarf_293bed::ConditionHelper
          (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           *out,Value *value)

{
  bool bVar1;
  int iVar2;
  ReadFileResult RVar3;
  Condition *pCVar4;
  Value *pVVar5;
  EqualsCondition *out_00;
  Condition *pCVar6;
  String type;
  String local_40;
  
  if (value == (Value *)0x0) {
    pCVar6 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = (Condition *)0x0;
LAB_001b4fde:
    if (pCVar6 != (Condition *)0x0) {
      (*pCVar6->_vptr_Condition[1])();
    }
    return READ_OK;
  }
  bVar1 = Json::Value::isBool(value);
  if (bVar1) {
    pCVar4 = (Condition *)operator_new(0x10);
    pCVar4->_vptr_Condition = (_func_int **)0x0;
    pCVar4[1]._vptr_Condition = (_func_int **)0x0;
    pCVar4->_vptr_Condition = (_func_int **)&PTR__Condition_008c97d0;
    bVar1 = Json::Value::asBool(value);
    *(bool *)&pCVar4[1]._vptr_Condition = bVar1;
    pCVar6 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = pCVar4;
    goto LAB_001b4fde;
  }
  bVar1 = Json::Value::isNull(value);
  if (bVar1) {
    pCVar4 = (Condition *)operator_new(8);
    pCVar4->_vptr_Condition = (_func_int **)&PTR__Condition_008c9818;
    pCVar6 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = pCVar4;
    goto LAB_001b4fde;
  }
  bVar1 = Json::Value::isObject(value);
  if (!bVar1) {
    return INVALID_CONDITION;
  }
  bVar1 = Json::Value::isMember(value,"type");
  RVar3 = INVALID_CONDITION;
  if (!bVar1) {
    return INVALID_CONDITION;
  }
  pVVar5 = Json::Value::operator[](value,"type");
  bVar1 = Json::Value::isString(pVVar5);
  if (!bVar1) {
    return INVALID_CONDITION;
  }
  pVVar5 = Json::Value::operator[](value,"type");
  Json::Value::asString_abi_cxx11_(&local_40,pVVar5);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
    out_00 = (EqualsCondition *)operator_new(0x10);
    (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
    (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
    (out_00->super_Condition)._vptr_Condition = (_func_int **)&PTR__Condition_008c97d0;
    RVar3 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
            Object<cmCMakePresetsGraphInternal::ConstCondition>::operator()
                      ((Object<cmCMakePresetsGraphInternal::ConstCondition> *)
                       (anonymous_namespace)::ConstConditionHelper,(ConstCondition *)out_00,value);
LAB_001b523d:
    if (RVar3 == READ_OK) {
      pCVar6 = (out->_M_t).
               super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
      (out->_M_t).
      super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
      .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
           &out_00->super_Condition;
      if (pCVar6 != (Condition *)0x0) {
        (*pCVar6->_vptr_Condition[1])();
      }
LAB_001b53cf:
      out_00 = (EqualsCondition *)0x0;
      RVar3 = READ_OK;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_40);
    if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_40), iVar2 == 0)) {
      out_00 = (EqualsCondition *)operator_new(0x48);
      (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
      (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
      (out_00->Lhs)._M_string_length = 0;
      (out_00->Lhs).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)(out_00->Lhs).field_2._M_local_buf + 8) = 0;
      (out_00->Rhs)._M_dataplus._M_p = (pointer)0x0;
      (out_00->Rhs)._M_string_length = 0;
      (out_00->Rhs).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)(out_00->Rhs).field_2._M_local_buf + 8) = 0;
      (out_00->super_Condition)._vptr_Condition = (_func_int **)&PTR__EqualsCondition_008c93e0;
      (out_00->Lhs)._M_dataplus._M_p = (pointer)&(out_00->Lhs).field_2;
      (out_00->Lhs)._M_string_length = 0;
      (out_00->Lhs).field_2._M_local_buf[0] = '\0';
      (out_00->Rhs)._M_dataplus._M_p = (pointer)&(out_00->Rhs).field_2;
      (out_00->Rhs)._M_string_length = 0;
      (out_00->Rhs).field_2._M_local_buf[0] = '\0';
      RVar3 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
              Object<cmCMakePresetsGraphInternal::EqualsCondition>::operator()
                        ((Object<cmCMakePresetsGraphInternal::EqualsCondition> *)
                         (anonymous_namespace)::EqualsConditionHelper,out_00,value);
      if (RVar3 == READ_OK) {
        pCVar6 = (out->_M_t).
                 super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
        (out->_M_t).
        super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
        .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
             (Condition *)out_00;
        if (pCVar6 != (Condition *)0x0) {
          (*pCVar6->_vptr_Condition[1])();
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_40);
        if (iVar2 == 0) {
          pCVar6 = (out->_M_t).
                   super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
          (out->_M_t).
          super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
               (Condition *)0x0;
          pCVar4 = (Condition *)operator_new(0x10);
LAB_001b53b4:
          pCVar4->_vptr_Condition = (_func_int **)0x0;
          pCVar4[1]._vptr_Condition = (_func_int **)0x0;
          pCVar4->_vptr_Condition = (_func_int **)&PTR__NotCondition_008c9500;
          pCVar4[1]._vptr_Condition = (_func_int **)pCVar6;
          (out->_M_t).
          super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = pCVar4;
        }
        goto LAB_001b53cf;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_40);
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_40), iVar2 == 0)) {
        out_00 = (EqualsCondition *)operator_new(0x40);
        (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
        (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
        (out_00->Lhs)._M_string_length = 0;
        (out_00->Lhs).field_2._M_allocated_capacity = 0;
        (out_00->Rhs)._M_string_length = 0;
        (out_00->Rhs).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)(out_00->Lhs).field_2._M_local_buf + 8) = 0;
        (out_00->Rhs)._M_dataplus._M_p = (pointer)0x0;
        (out_00->super_Condition)._vptr_Condition = (_func_int **)&PTR__InListCondition_008c9428;
        (out_00->Lhs)._M_dataplus._M_p = (pointer)&(out_00->Lhs).field_2;
        (out_00->Lhs)._M_string_length = 0;
        (out_00->Lhs).field_2._M_local_buf[0] = '\0';
        (out_00->Rhs)._M_dataplus._M_p = (pointer)0x0;
        (out_00->Rhs)._M_string_length = 0;
        (out_00->Rhs).field_2._M_allocated_capacity = 0;
        RVar3 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                Object<cmCMakePresetsGraphInternal::InListCondition>::operator()
                          ((Object<cmCMakePresetsGraphInternal::InListCondition> *)
                           (anonymous_namespace)::InListConditionHelper,(InListCondition *)out_00,
                           value);
        if (RVar3 == READ_OK) {
          pCVar6 = (out->_M_t).
                   super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
          (out->_M_t).
          super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
               (Condition *)out_00;
          if (pCVar6 != (Condition *)0x0) {
            (*pCVar6->_vptr_Condition[1])();
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_40);
          if (iVar2 == 0) {
            pCVar6 = (out->_M_t).
                     super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                     .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
            (out->_M_t).
            super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                 (Condition *)0x0;
            pCVar4 = (Condition *)operator_new(0x10);
            goto LAB_001b53b4;
          }
          goto LAB_001b53cf;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_40);
        if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)&local_40), iVar2 != 0))
        {
          iVar2 = std::__cxx11::string::compare((char *)&local_40);
          if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_40), iVar2 == 0)
             ) {
            out_00 = (EqualsCondition *)operator_new(0x28);
            (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
            (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
            (out_00->Lhs)._M_string_length = 0;
            (out_00->Lhs).field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&(out_00->Lhs).field_2 + 8) = 0;
            (out_00->super_Condition)._vptr_Condition =
                 (_func_int **)&PTR__AnyAllOfCondition_008c94b8;
            (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
            (out_00->Lhs)._M_string_length = 0;
            (out_00->Lhs).field_2._M_allocated_capacity = 0;
            iVar2 = std::__cxx11::string::compare((char *)&local_40);
            (out_00->Lhs).field_2._M_local_buf[8] = iVar2 == 0;
            RVar3 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                    Object<cmCMakePresetsGraphInternal::AnyAllOfCondition>::operator()
                              ((Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> *)
                               (anonymous_namespace)::AnyAllOfConditionHelper,
                               (AnyAllOfCondition *)out_00,value);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_40);
            if (iVar2 != 0) {
              bVar1 = true;
              goto LAB_001b53e4;
            }
            out_00 = (EqualsCondition *)operator_new(0x10);
            (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
            (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
            (out_00->super_Condition)._vptr_Condition = (_func_int **)&PTR__NotCondition_008c9500;
            (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
            RVar3 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                    Object<cmCMakePresetsGraphInternal::NotCondition>::operator()
                              ((Object<cmCMakePresetsGraphInternal::NotCondition> *)
                               (anonymous_namespace)::NotConditionHelper,(NotCondition *)out_00,
                               value);
          }
          goto LAB_001b523d;
        }
        out_00 = (EqualsCondition *)operator_new(0x48);
        (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
        (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
        (out_00->Lhs)._M_string_length = 0;
        (out_00->Lhs).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)(out_00->Lhs).field_2._M_local_buf + 8) = 0;
        (out_00->Rhs)._M_dataplus._M_p = (pointer)0x0;
        (out_00->Rhs)._M_string_length = 0;
        (out_00->Rhs).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)(out_00->Rhs).field_2._M_local_buf + 8) = 0;
        (out_00->super_Condition)._vptr_Condition = (_func_int **)&PTR__MatchesCondition_008c9470;
        (out_00->Lhs)._M_dataplus._M_p = (pointer)&(out_00->Lhs).field_2;
        (out_00->Lhs)._M_string_length = 0;
        (out_00->Lhs).field_2._M_local_buf[0] = '\0';
        (out_00->Rhs)._M_dataplus._M_p = (pointer)&(out_00->Rhs).field_2;
        (out_00->Rhs)._M_string_length = 0;
        (out_00->Rhs).field_2._M_local_buf[0] = '\0';
        RVar3 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                Object<cmCMakePresetsGraphInternal::MatchesCondition>::operator()
                          ((Object<cmCMakePresetsGraphInternal::MatchesCondition> *)
                           (anonymous_namespace)::MatchesConditionHelper,(MatchesCondition *)out_00,
                           value);
        if (RVar3 == READ_OK) {
          pCVar6 = (out->_M_t).
                   super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
          (out->_M_t).
          super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
               (Condition *)out_00;
          if (pCVar6 != (Condition *)0x0) {
            (*pCVar6->_vptr_Condition[1])();
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_40);
          if (iVar2 == 0) {
            pCVar6 = (out->_M_t).
                     super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                     .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
            (out->_M_t).
            super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                 (Condition *)0x0;
            pCVar4 = (Condition *)operator_new(0x10);
            goto LAB_001b53b4;
          }
          goto LAB_001b53cf;
        }
      }
    }
  }
  if (out_00 != (EqualsCondition *)0x0) {
    (*(out_00->super_Condition)._vptr_Condition[1])(out_00);
  }
  bVar1 = false;
LAB_001b53e4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    return INVALID_CONDITION;
  }
  return RVar3;
}

Assistant:

ReadFileResult ConditionHelper(
  std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
  const Json::Value* value)
{
  if (!value) {
    out.reset();
    return ReadFileResult::READ_OK;
  }

  if (value->isBool()) {
    auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    c->Value = value->asBool();
    out = std::move(c);
    return ReadFileResult::READ_OK;
  }

  if (value->isNull()) {
    out = cm::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
    return ReadFileResult::READ_OK;
  }

  if (value->isObject()) {
    if (!value->isMember("type")) {
      return ReadFileResult::INVALID_CONDITION;
    }

    if (!(*value)["type"].isString()) {
      return ReadFileResult::INVALID_CONDITION;
    }
    auto type = (*value)["type"].asString();

    if (type == "const") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
      CHECK_OK(ConstConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }

    if (type == "equals" || type == "notEquals") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
      CHECK_OK(EqualsConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notEquals") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "inList" || type == "notInList") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
      CHECK_OK(InListConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notInList") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "matches" || type == "notMatches") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
      CHECK_OK(MatchesConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notMatches") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "anyOf" || type == "allOf") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
      c->StopValue = (type == "anyOf");
      CHECK_OK(AnyAllOfConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }

    if (type == "not") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
      CHECK_OK(NotConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }
  }

  return ReadFileResult::INVALID_CONDITION;
}